

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.cpp
# Opt level: O2

void __thiscall NetworkNS::RanMars::RanMars(RanMars *this,int seed)

{
  uint uVar1;
  int iVar2;
  RanMars *this_00;
  bool bVar3;
  
  this->x = 0x75bcd15;
  this->y = 0x3ade68b1;
  this->z = 0x2937ba4;
  this->c = 0x63d771;
  this_00 = this;
  uVar1 = devrand(this);
  this->x = uVar1;
  do {
    uVar1 = devrand(this_00);
    this->y = uVar1;
  } while (uVar1 == 0);
  uVar1 = devrand(this_00);
  this->z = uVar1;
  uVar1 = devrand(this_00);
  this->c = uVar1 % 0x29a65eac + 1;
  iVar2 = 1000000;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    uint_rand(this);
  }
  return;
}

Assistant:

RanMars::RanMars(int seed) {
      /* Seed variables */
        x = 123456789;
        y = 987654321;
        z = 43219876;
        c = 6543217; 
        
        x = devrand();
        while (!(y = devrand())); /* y must not be zero! */
        z = devrand();
        
        /* We don’t really need to set c as well but let's anyway... */
        /* NOTE: offset c by 1 to avoid z=c=0 */
        c = devrand() % 698769068 + 1; /* Should be less than 698769069 */

        // gvog: And warm up the generator:
        /* Also, discard the first values... */
        int i, nelements = 1000000;
        //unsigned int temp;
        for (i = 0; i < nelements; i++)
            uint_rand();

        return;
   }